

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O1

void Am_Choice_Set_Value(Am_Object *inter,bool set_selected)

{
  Am_Value_Type type;
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  ostream *poVar4;
  Am_Value_List *pAVar5;
  Am_Object *pAVar6;
  Am_Object *this;
  Am_Object old_value_obj;
  Am_Object new_value;
  Am_Value_List old_value_list;
  Am_Value old_value;
  Am_Choice_How_Set how_set;
  Am_Object local_60;
  Am_Object local_58;
  Am_Value_List local_50;
  Am_Value local_40;
  anon_union_8_8_ea4c8939_for_value local_30;
  
  pAVar2 = Am_Object::Get(inter,0x16a,0);
  Am_Object::Am_Object(&local_58,pAVar2);
  pAVar2 = Am_Object::Get(inter,0xd4,0);
  if ((pAVar2->type != 1) && (pAVar2->type != Am_Choice_How_Set::Am_Choice_How_Set_ID)) {
    Am_Choice_How_Set::TypeError((Am_Choice_How_Set *)&local_30,pAVar2);
  }
  local_30 = pAVar2->value;
  local_40.type = 0;
  local_40.value.wrapper_value = (Am_Wrapper *)0x0;
  local_60.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_50);
  pAVar2 = Am_Object::Get(inter,0x169,1);
  Am_Value::operator=(&local_40,pAVar2);
  type = local_40.type;
  bVar1 = Am_Value::Valid(&local_40);
  if (bVar1) {
    if (type == 0xa001) {
      Am_Object::operator=(&local_60,&local_40);
    }
    else {
      bVar1 = Am_Value_List::Test(&local_40);
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"** Amulet Error: Bad type ",0x1a);
        Am_Print_Type((ostream *)&std::cerr,type);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," in VALUE of inter ",0x13);
        poVar4 = operator<<((ostream *)&std::cerr,inter);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
        poVar4 = operator<<(poVar4,&local_40);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::ostream::flush();
        goto LAB_001b3555;
      }
      Am_Value_List::operator=(&local_50,&local_40);
    }
  }
  if (type == 0xa001) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_60);
  }
  else {
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_50);
  }
  Am_Object::Set(inter,0x16c,pAVar3,1);
  this = &local_60;
  if (local_30.wrapper_value == (Am_Wrapper *)Am_CHOICE_LIST_TOGGLE.value) {
    pAVar5 = &local_50;
    if (type == 0xa001) {
      bVar1 = Am_Object::operator==(&local_60,&local_58);
      if (bVar1) {
        if ((set_selected) && (bVar1 = Am_Object::Valid(this), bVar1)) {
          bVar1 = false;
LAB_001b33f1:
          Am_Object::Set(this,0x172,bVar1,1);
          pAVar5 = &local_50;
        }
      }
      else {
        bVar1 = Am_Object::Valid(this);
        if (bVar1) {
          pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_60);
          Am_Value_List::Add(&local_50,pAVar3,Am_TAIL,true);
        }
        bVar1 = Am_Object::Valid(&local_58);
        if (bVar1) {
          pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_58);
          Am_Value_List::Add(&local_50,pAVar3,Am_TAIL,true);
LAB_001b33ea:
          this = &local_58;
          bVar1 = true;
          pAVar5 = &local_50;
          if (set_selected) goto LAB_001b33f1;
        }
      }
    }
    else {
      Am_Value_List::Start(&local_50);
      bVar1 = Am_Object::Valid(&local_58);
      if (!bVar1) goto LAB_001b3423;
      pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_58);
      bVar1 = Am_Value_List::Member(&local_50,pAVar3);
      if (!bVar1) {
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_58);
        Am_Value_List::Add(&local_50,pAVar3,Am_TAIL,true);
        goto LAB_001b33ea;
      }
      if (set_selected) {
        Am_Object::Set(&local_58,0x172,false,1);
      }
      Am_Value_List::Delete(&local_50,true);
      bVar1 = Am_Value_List::Empty(&local_50);
      pAVar5 = &local_50;
      if (bVar1) {
        pAVar5 = &Am_No_Value_List;
      }
    }
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar5);
  }
  else {
    if (type == 0xa001) {
      pAVar6 = &local_58;
      if (local_30.wrapper_value == (Am_Wrapper *)Am_CHOICE_SET.value) {
        if (set_selected) {
          bVar1 = Am_Object::Valid(&local_60);
          if (bVar1) {
            Am_Object::Set(this,0x172,false,1);
          }
          if (set_selected) {
            bVar1 = Am_Object::Valid(&local_58);
LAB_001b3113:
            pAVar6 = &local_58;
            if (bVar1 != false) {
              Am_Object::Set(&local_58,0x172,true,1);
              pAVar6 = &local_58;
            }
          }
        }
      }
      else if (local_30.wrapper_value == (Am_Wrapper *)Am_CHOICE_CLEAR.value) {
        pAVar6 = &Am_No_Object;
        if (set_selected) {
          bVar1 = Am_Object::Valid(&local_60);
LAB_001b32f1:
          pAVar6 = &Am_No_Object;
          if (bVar1 != false) {
            Am_Object::Set(&local_60,0x172,false,1);
            pAVar6 = &Am_No_Object;
          }
        }
      }
      else {
        if (local_30.wrapper_value != (Am_Wrapper *)Am_CHOICE_TOGGLE.value) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"** Amulet Error: Illegal how_set ",0x21);
          poVar4 = operator<<((ostream *)&std::cerr,(Am_Choice_How_Set *)&local_30);
          std::endl<char,std::char_traits<char>>(poVar4);
LAB_001b3555:
          Am_Error();
        }
        bVar1 = Am_Object::operator==(&local_60,&local_58);
        if (bVar1) {
          pAVar6 = &Am_No_Object;
          if (set_selected) {
            bVar1 = Am_Object::Valid(this);
            goto LAB_001b32f1;
          }
        }
        else {
          pAVar6 = &local_58;
          if (set_selected) {
            bVar1 = Am_Object::Valid(this);
            if (bVar1) {
              Am_Object::Set(&local_60,0x172,false,1);
            }
            if (set_selected) {
              bVar1 = Am_Object::Valid(&local_58);
              goto LAB_001b3113;
            }
          }
        }
      }
    }
    else {
      Am_Value_List::Start(&local_50);
      bVar1 = Am_Object::Valid(&local_58);
      if (bVar1) {
        if (local_30.wrapper_value == (Am_Wrapper *)Am_CHOICE_CLEAR.value) {
LAB_001b31f1:
          Am_Object::operator=(&local_58,&Am_No_Object);
        }
        else {
          if (local_30.wrapper_value == (Am_Wrapper *)Am_CHOICE_LIST_TOGGLE.value) {
            pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_58);
            bVar1 = Am_Value_List::Member(&local_50,pAVar3);
            if (bVar1) goto LAB_001b31f1;
          }
          if (set_selected) {
            Am_Object::Set(&local_58,0x172,true,1);
          }
        }
      }
      Am_Value_List::Start(&local_50);
      while (bVar1 = Am_Value_List::Last(&local_50), pAVar6 = &local_58, !bVar1) {
        pAVar2 = Am_Value_List::Get(&local_50);
        Am_Object::operator=(&local_60,pAVar2);
        if ((set_selected) && (bVar1 = Am_Object::operator!=(&local_60,&local_58), bVar1)) {
          Am_Object::Set(&local_60,0x172,false,1);
        }
        Am_Value_List::Next(&local_50);
      }
    }
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  }
  Am_Object::Set(inter,0x169,pAVar3,0);
LAB_001b3423:
  Am_Value_List::~Am_Value_List(&local_50);
  Am_Object::~Am_Object(&local_60);
  Am_Value::~Am_Value(&local_40);
  Am_Object::~Am_Object(&local_58);
  return;
}

Assistant:

void
Am_Choice_Set_Value(Am_Object inter, bool set_selected)
{
  Am_Object new_value = inter.Get(Am_INTERIM_VALUE);
  Am_Choice_How_Set how_set = inter.Get(Am_HOW_SET);

  // now set real value

  // first check if slot contains correct type: single object or list
  Am_Value old_value;
  Am_Object old_value_obj;
  Am_Value_List old_value_list;
  old_value = inter.Peek(Am_VALUE);
  Am_Value_Type old_value_type = old_value.type;
  // if not valid, old_value_obj and old_value_list already are not valid
  if (old_value.Valid()) {
    if (old_value_type == Am_OBJECT)
      old_value_obj = old_value;
    else if (Am_Value_List::Test(old_value))
      old_value_list = old_value;
    else {
      std::cerr << "** Amulet Error: Bad type ";
      Am_Print_Type(std::cerr, old_value_type);
      std::cerr << " in VALUE of inter " << inter << " = " << old_value
                << std::endl
                << std::flush;
      Am_Error();
    }
  }

  //save current value as old in case needed for undo
  if (old_value_type == Am_OBJECT)
    inter.Set(Am_OLD_VALUE, old_value_obj, Am_OK_IF_NOT_THERE);
  else
    inter.Set(Am_OLD_VALUE, old_value_list, Am_OK_IF_NOT_THERE);

  if (how_set == Am_CHOICE_LIST_TOGGLE) {
    if (old_value_type == Am_OBJECT) {
      // used to be a single value, might become a list
      if (old_value_obj == new_value) {
        if (set_selected && old_value_obj.Valid()) {
          Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
          old_value_obj.Set(Am_SELECTED, false,
                            Am_OK_IF_NOT_THERE); // and leave new list empty
        }
      } else { // old value is a list
        // put them both in the new list
        if (old_value_obj.Valid())
          old_value_list.Add(old_value_obj);
        if (new_value.Valid()) {
          old_value_list.Add(new_value);
          if (set_selected) {
            Am_REPORT_SET_SEL_VALUE(true, inter, new_value, true);
            new_value.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
          }
        }
      }
      //put new list into slot.
      inter.Set(Am_VALUE, old_value_list);
    } else {
      // originally a list, will stay a list or get cleared
      old_value_list.Start(); // initialize list for Member or for loop
      if (!new_value.Valid()) {
      } /*  Don't do anything *********
	       // { // clear out list
	       // // clear all the SELECTED slots of the individual objects
	       // for ( ; !old_value_list.Last (); old_value_list.Next ()) {
	       // old_value_obj = old_value_list.Get ();
	       // Am_REPORT_SET_SEL_VALUE (true, inter, old_value_obj, false);
	       // old_value_obj.Set (Am_SELECTED, false);
	       // }
	       // // forget about the list; just make it an empty object.
	       // inter.Set (Am_VALUE, new_value);
	       // } // end of if (!new_value)
      */
      // old_value_list exists, new_value exists
      else if (old_value_list.Member(new_value)) {
        if (set_selected) {
          Am_REPORT_SET_SEL_VALUE(true, inter, new_value, false);
          new_value.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
        }
        old_value_list.Delete();
        if (old_value_list.Empty())
          // no objects left in list, so don't store empty list
          inter.Set(Am_VALUE, Am_No_Value_List);
        else
          inter.Set(Am_VALUE, old_value_list);
      } else { // add it at end
        old_value_list.Add(new_value);
        if (set_selected) {
          Am_REPORT_SET_SEL_VALUE(true, inter, new_value, true);
          new_value.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
        }
        inter.Set(Am_VALUE, old_value_list);
      }
    }
  }      // end of how_set == List toggle
  else { // single value
    if (old_value_type == Am_OBJECT) {
      // single new value, single old value
      if (how_set == Am_CHOICE_SET) {
        if (set_selected && old_value_obj.Valid()) {
          Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
          old_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
        }
        if (set_selected && new_value.Valid()) {
          Am_REPORT_SET_SEL_VALUE(true, inter, new_value, true);
          new_value.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
        }
        inter.Set(Am_VALUE, new_value); // put new value into slot
      } else if (how_set == Am_CHOICE_CLEAR) {
        if (set_selected && old_value_obj.Valid()) {
          Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
          old_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
        }
        inter.Set(Am_VALUE, Am_No_Object); // empty
      } else if (how_set == Am_CHOICE_TOGGLE) {
        if (old_value_obj == new_value) {
          if (set_selected && old_value_obj.Valid()) {
            Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
            old_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
          }
          inter.Set(Am_VALUE, Am_No_Object); // empty
        } else {                             // set with new value
          if (set_selected && old_value_obj.Valid()) {
            Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
            old_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
          }
          if (set_selected && new_value.Valid()) {
            Am_REPORT_SET_SEL_VALUE(true, inter, new_value, true);
            new_value.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
          }
          inter.Set(Am_VALUE, new_value); // put new value into slot
        }
      } else {
        std::cerr << "** Amulet Error: Illegal how_set " << how_set
                  << std::endl;
        Am_Error();
      }
    } else {
      // used to be multiple values, now is just one
      old_value_list.Start(); // set pointer back to the beginning
      // see if new object should NOT be in the set
      if (new_value.Valid()) {
        if ((how_set == Am_CHOICE_CLEAR) || (how_set == Am_CHOICE_LIST_TOGGLE &&
                                             old_value_list.Member(new_value)))
          new_value = Am_No_Object;
        else {
          if (set_selected) {
            // item must be selected if not previously in list or being cleared
            Am_REPORT_SET_SEL_VALUE(true, inter, new_value, true);
            new_value.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
          }
        }
      }
      for (old_value_list.Start(); !old_value_list.Last();
           old_value_list.Next()) {
        old_value_obj = old_value_list.Get();
        if (set_selected && old_value_obj != new_value) {
          Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
          //clear all the other values
          old_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
        }
      }
      //put new value into slot. Will automatically deallocate old_value_list
      inter.Set(Am_VALUE, new_value);
    } // else single old value
  }   // else single new value
}